

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

void xmlCleanupOutputCallbacks(void)

{
  if (xmlOutputCallbackInitialized == '\x01') {
    if (0 < (long)xmlOutputCallbackNr) {
      memset(xmlOutputCallbackTable,0,(long)xmlOutputCallbackNr << 5);
    }
    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = '\0';
  }
  return;
}

Assistant:

void
xmlCleanupOutputCallbacks(void)
{
    int i;

    if (!xmlOutputCallbackInitialized)
        return;

    for (i = xmlOutputCallbackNr - 1; i >= 0; i--) {
        xmlOutputCallbackTable[i].matchcallback = NULL;
        xmlOutputCallbackTable[i].opencallback = NULL;
        xmlOutputCallbackTable[i].writecallback = NULL;
        xmlOutputCallbackTable[i].closecallback = NULL;
    }

    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = 0;
}